

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void gen_add_insn_before(gen_ctx_t gen_ctx,MIR_insn_t before,MIR_insn_t insn)

{
  MIR_context_t ctx_00;
  int iVar1;
  MIR_insn_t before_00;
  MIR_insn_t local_30;
  MIR_insn_t insn_for_bb;
  MIR_context_t ctx;
  MIR_insn_t insn_local;
  MIR_insn_t before_local;
  gen_ctx_t gen_ctx_local;
  
  ctx_00 = gen_ctx->ctx;
  iVar1 = MIR_any_branch_code_p((MIR_insn_code_t)*(undefined8 *)&insn->field_0x18);
  if ((iVar1 != 0) || ((int)*(undefined8 *)&insn->field_0x18 == 0xb4)) {
    __assert_fail("!MIR_any_branch_code_p (insn->code) && insn->code != MIR_LABEL",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x2af,"void gen_add_insn_before(gen_ctx_t, MIR_insn_t, MIR_insn_t)");
  }
  local_30 = before;
  if (((int)*(undefined8 *)&before->field_0x18 == 0xb4) &&
     ((local_30 = DLIST_MIR_insn_t_prev(before), local_30 != (MIR_insn_t)0x0 &&
      (iVar1 = MIR_any_branch_code_p((MIR_insn_code_t)*(undefined8 *)&local_30->field_0x18),
      iVar1 != 0)))) {
    __assert_fail("insn_for_bb == ((void*)0) || !MIR_any_branch_code_p (insn_for_bb->code)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x2b2,"void gen_add_insn_before(gen_ctx_t, MIR_insn_t, MIR_insn_t)");
  }
  MIR_insert_insn_before(ctx_00,gen_ctx->curr_func_item,before,insn);
  before_00 = DLIST_MIR_insn_t_prev(insn);
  create_new_bb_insns(gen_ctx,before_00,before,local_30);
  return;
}

Assistant:

static void gen_add_insn_before (gen_ctx_t gen_ctx, MIR_insn_t before, MIR_insn_t insn) {
  MIR_context_t ctx = gen_ctx->ctx;
  MIR_insn_t insn_for_bb = before;

  gen_assert (!MIR_any_branch_code_p (insn->code) && insn->code != MIR_LABEL);
  if (before->code == MIR_LABEL) {
    insn_for_bb = DLIST_PREV (MIR_insn_t, before);
    gen_assert (insn_for_bb == NULL || !MIR_any_branch_code_p (insn_for_bb->code));
  }
  MIR_insert_insn_before (ctx, curr_func_item, before, insn);
  create_new_bb_insns (gen_ctx, DLIST_PREV (MIR_insn_t, insn), before, insn_for_bb);
}